

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::setHorizontalScrollMode(QAbstractItemView *this,ScrollMode mode)

{
  QAbstractItemViewPrivate *pQVar1;
  ScrollMode in_ESI;
  QAbstractSliderPrivate *in_RDI;
  QAbstractItemViewPrivate *d;
  int in_stack_ffffffffffffffdc;
  
  pQVar1 = d_func((QAbstractItemView *)0x802e80);
  pQVar1->horizontalScrollModeSet = true;
  if (in_ESI != pQVar1->horizontalScrollMode) {
    pQVar1->horizontalScrollMode = in_ESI;
    if (in_ESI == ScrollPerItem) {
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_RDI);
      QScrollBar::d_func((QScrollBar *)0x802ecc);
      QAbstractSliderPrivate::itemviewChangeSingleStep(in_RDI,in_stack_ffffffffffffffdc);
    }
    else {
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_RDI);
      QAbstractSlider::setSingleStep((QAbstractSlider *)in_RDI,in_stack_ffffffffffffffdc);
    }
    (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x268))();
  }
  return;
}

Assistant:

void QAbstractItemView::setHorizontalScrollMode(ScrollMode mode)
{
    Q_D(QAbstractItemView);
    d->horizontalScrollModeSet = true;
    if (mode == d->horizontalScrollMode)
        return;
    d->horizontalScrollMode = mode;
    if (mode == ScrollPerItem)
        horizontalScrollBar()->d_func()->itemviewChangeSingleStep(1); // setSingleStep(-1) => step with 1
    else
        horizontalScrollBar()->setSingleStep(-1); // Ensure that the view can update single step
    updateGeometries(); // update the scroll bars
}